

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O2

void strings_equal<wchar_t>
               (string *n_s,string *n_p,int n,string *iexpected,locale *l,string *domain)

{
  int iVar1;
  bool bVar2;
  __type _Var3;
  ostream *poVar4;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar5;
  runtime_error *prVar6;
  size_t sVar7;
  void *__buf;
  void *__buf_00;
  locale tmp_locale;
  allocator local_2e9;
  string_type tmp;
  string_type p;
  string_type s;
  locale local_288;
  string_type expected;
  undefined1 local_260 [32];
  _Alloc_hider local_240;
  size_type local_238;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_230;
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_210;
  _Alloc_hider local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_1f0;
  locale local_1e0;
  locale local_1d8;
  locale local_1d0;
  locale local_1c8;
  locale local_1c0;
  locale local_1b8;
  locale local_1b0;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> ss;
  
  std::locale::locale(&local_288,l);
  to_correct_string<wchar_t>(&expected,iexpected,&local_288);
  std::locale::~locale(&local_288);
  std::__cxx11::string::string((string *)&ss,(n_s->_M_dataplus)._M_p,(allocator *)local_260);
  to<wchar_t>(&s,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,(n_p->_M_dataplus)._M_p,(allocator *)local_260);
  to<wchar_t>(&p,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  bVar2 = std::operator==(domain,"default");
  if (bVar2) {
    test_counter = test_counter + 1;
    booster::locale::basic_message<wchar_t>::basic_message((basic_message<wchar_t> *)&ss,&s,&p,n);
    booster::locale::basic_message<wchar_t>::str_abi_cxx11_
              ((string_type *)local_260,(basic_message<wchar_t> *)&ss,l);
    _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_260,&expected);
    std::__cxx11::wstring::~wstring((wstring *)local_260);
    booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)&ss);
    if (!_Var3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x7d);
      poVar4 = std::operator<<(poVar4," bl::translate(s,p,n).str(l)==expected");
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar1 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar2) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_260);
        booster::runtime_error::runtime_error(prVar6,(string *)&ss);
        __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    test_counter = test_counter + 1;
    _ss = n;
    booster::locale::basic_message<wchar_t>::str_abi_cxx11_
              ((string_type *)local_260,(basic_message<wchar_t> *)&ss,l);
    _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_260,&expected);
    std::__cxx11::wstring::~wstring((wstring *)local_260);
    booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)&ss);
    if (!_Var3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x7f);
      poVar4 = std::operator<<(poVar4," bl::translate(s_c_str,p_c_str,n).str(l)==expected");
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar1 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar2) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_260);
        booster::runtime_error::runtime_error(prVar6,(string *)&ss);
        __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    std::locale::locale(&tmp_locale);
    std::locale::global(&local_1b0);
    std::locale::~locale(&local_1b0);
    booster::locale::basic_message<wchar_t>::basic_message((basic_message<wchar_t> *)&ss,&s,&p,n);
    booster::locale::basic_message<wchar_t>::str_abi_cxx11_(&tmp,(basic_message<wchar_t> *)&ss);
    booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)&ss);
    test_counter = test_counter + 1;
    _Var3 = std::operator==(&tmp,&expected);
    if (!_Var3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x83);
      poVar4 = std::operator<<(poVar4," tmp==expected");
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar1 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar2) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_260);
        booster::runtime_error::runtime_error(prVar6,(string *)&ss);
        __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    booster::locale::basic_message<wchar_t>::basic_message((basic_message<wchar_t> *)&ss,&s,&p,n);
    booster::locale::basic_message<wchar_t>::str_abi_cxx11_
              ((string_type *)local_260,(basic_message<wchar_t> *)&ss);
    std::__cxx11::wstring::operator=((wstring *)&tmp,(wstring *)local_260);
    std::__cxx11::wstring::~wstring((wstring *)local_260);
    booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)&ss);
    test_counter = test_counter + 1;
    _Var3 = std::operator==(&tmp,&expected);
    if (!_Var3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x85);
      poVar4 = std::operator<<(poVar4," tmp==expected");
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar1 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar2) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_260);
        booster::runtime_error::runtime_error(prVar6,(string *)&ss);
        __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    std::locale::global(&local_1b8);
    std::locale::~locale(&local_1b8);
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&ss);
    std::wios::imbue(&local_1c0);
    std::locale::~locale(&local_1c0);
    sVar7 = (size_t)(uint)n;
    booster::locale::basic_message<wchar_t>::basic_message
              ((basic_message<wchar_t> *)local_260,&s,&p,n);
    booster::locale::basic_message<wchar_t>::write
              ((basic_message<wchar_t> *)local_260,(int)&ss,__buf,sVar7);
    booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)local_260);
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_260,&expected);
    std::__cxx11::wstring::~wstring((wstring *)local_260);
    if (!_Var3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x8b);
      poVar4 = std::operator<<(poVar4," ss.str()==expected");
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar1 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar2) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_260,"Error limits reached, stopping unit test",&local_2e9);
        booster::runtime_error::runtime_error(prVar6,(string *)local_260);
        __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)&ss);
    std::__cxx11::wstring::~wstring((wstring *)&tmp);
    std::locale::~locale(&tmp_locale);
  }
  test_counter = test_counter + 1;
  booster::locale::basic_message<wchar_t>::basic_message((basic_message<wchar_t> *)&ss,&s,&p,n);
  booster::locale::basic_message<wchar_t>::str
            ((string_type *)local_260,(basic_message<wchar_t> *)&ss,l,domain);
  _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_260,&expected);
  std::__cxx11::wstring::~wstring((wstring *)local_260);
  booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)&ss);
  if (!_Var3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x8d);
    poVar4 = std::operator<<(poVar4," bl::translate(s,p,n).str(l,domain)==expected");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_260);
      booster::runtime_error::runtime_error(prVar6,(string *)&ss);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::locale(&tmp_locale);
  std::locale::global(&local_1c8);
  std::locale::~locale(&local_1c8);
  test_counter = test_counter + 1;
  booster::locale::basic_message<wchar_t>::basic_message((basic_message<wchar_t> *)&ss,&s,&p,n);
  booster::locale::basic_message<wchar_t>::str
            ((string_type *)local_260,(basic_message<wchar_t> *)&ss,domain);
  _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_260,&expected);
  std::__cxx11::wstring::~wstring((wstring *)local_260);
  booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)&ss);
  if (!_Var3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x90);
    poVar4 = std::operator<<(poVar4," bl::translate(s,p,n).str(domain)==expected");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_260);
      booster::runtime_error::runtime_error(prVar6,(string *)&ss);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::global(&local_1d0);
  std::locale::~locale(&local_1d0);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&ss);
  std::wios::imbue(&local_1d8);
  std::locale::~locale(&local_1d8);
  std::__cxx11::string::string((string *)&tmp,(string *)domain);
  pbVar5 = booster::locale::as::details::operator<<
                     ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)&ss,(set_domain *)&tmp);
  sVar7 = (size_t)(uint)n;
  booster::locale::basic_message<wchar_t>::basic_message
            ((basic_message<wchar_t> *)local_260,&s,&p,n);
  booster::locale::basic_message<wchar_t>::write
            ((basic_message<wchar_t> *)local_260,(int)pbVar5,__buf_00,sVar7);
  booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)local_260);
  std::__cxx11::string::~string((string *)&tmp);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_260,&expected);
  std::__cxx11::wstring::~wstring((wstring *)local_260);
  if (!_Var3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x96);
    poVar4 = std::operator<<(poVar4," ss.str()==expected");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_260,"Error limits reached, stopping unit test",(allocator *)&tmp);
      booster::runtime_error::runtime_error(prVar6,(string *)local_260);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)&ss);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&ss);
  std::wios::imbue(&local_1e0);
  std::locale::~locale(&local_1e0);
  std::__cxx11::string::string((string *)&tmp,(string *)domain);
  pbVar5 = booster::locale::as::details::operator<<
                     ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)&ss,(set_domain *)&tmp);
  local_240._M_p = (pointer)&local_230;
  local_260._8_8_ = s._M_dataplus._M_p;
  local_260._16_8_ = 0;
  local_260._24_8_ = p._M_dataplus._M_p;
  local_238 = 0;
  local_230._M_local_buf[0] = L'\0';
  local_220._M_p = (pointer)&local_210;
  local_218 = 0;
  local_210._M_local_buf[0] = L'\0';
  local_200._M_p = (pointer)&local_1f0;
  local_1f8 = 0;
  local_1f0._M_local_buf[0] = L'\0';
  local_260._0_4_ = n;
  booster::locale::basic_message<wchar_t>::write
            ((basic_message<wchar_t> *)local_260,(int)pbVar5,p._M_dataplus._M_p,
             (size_t)local_200._M_p);
  booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)local_260);
  std::__cxx11::string::~string((string *)&tmp);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_260,&expected);
  std::__cxx11::wstring::~wstring((wstring *)local_260);
  if (!_Var3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x9c);
    poVar4 = std::operator<<(poVar4," ss.str()==expected");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_260,"Error limits reached, stopping unit test",(allocator *)&tmp);
      booster::runtime_error::runtime_error(prVar6,(string *)local_260);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)&ss);
  std::locale::~locale(&tmp_locale);
  std::__cxx11::wstring::~wstring((wstring *)&p);
  std::__cxx11::wstring::~wstring((wstring *)&s);
  std::__cxx11::wstring::~wstring((wstring *)&expected);
  return;
}

Assistant:

void strings_equal(std::string n_s,std::string n_p,int n,std::string iexpected,std::locale const &l,std::string domain)
{
    typedef std::basic_string<Char> string_type;
    string_type expected=to_correct_string<Char>(iexpected,l);
    string_type s = to<Char>(n_s.c_str());
    string_type p = to<Char>(n_p.c_str());
    if(domain=="default") {
        TEST(bl::translate(s,p,n).str(l)==expected);
        Char const *s_c_str=s.c_str(), *p_c_str=p.c_str(); // workaround gcc-3.4 bug
        TEST(bl::translate(s_c_str,p_c_str,n).str(l)==expected);
        std::locale tmp_locale=std::locale();
        std::locale::global(l);
        string_type tmp=bl::translate(s,p,n);
        TEST(tmp==expected);
        tmp=bl::translate(s,p,n).str();
        TEST(tmp==expected);
        std::locale::global(tmp_locale);

        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::translate(s,p,n);
        TEST(ss.str()==expected);
    }
    TEST(bl::translate(s,p,n).str(l,domain)==expected);
    std::locale tmp_locale=std::locale();
    std::locale::global(l);
    TEST(bl::translate(s,p,n).str(domain)==expected);
    std::locale::global(tmp_locale);
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(s,p,n);
        TEST(ss.str()==expected);
    }
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(s.c_str(),p.c_str(),n);
        TEST(ss.str()==expected);
    }
}